

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteVmLoadCollection(unqlite_vm *pVm,char *zName,sxu32 nByte,int iFlag,unqlite_col **ppOut)

{
  SyMemBackend *pBackend;
  sxu32 sVar1;
  unqlite *pDb;
  unqlite_kv_engine *puVar2;
  unqlite_kv_methods *puVar3;
  ushort *puVar4;
  unqlite_col *puVar5;
  unqlite_col *puVar6;
  unqlite_kv_cursor *pCur;
  int iVar7;
  sxu32 sVar8;
  unqlite_col *pCol;
  char *pChunk;
  unqlite_col_record **pSrc;
  unqlite_col **ppuVar9;
  uint uVar10;
  unqlite_col **ppuVar11;
  bool bVar12;
  unqlite_kv_cursor *pCursor;
  unqlite_kv_engine *local_48;
  unqlite_col **local_40;
  sxu32 local_34;
  
  pDb = pVm->pDb;
  puVar2 = ((pDb->sDB).pPager)->pEngine;
  puVar3 = puVar2->pIo->pMethods;
  local_40 = ppOut;
  iVar7 = unqliteInitCursor(pDb,&pCursor);
  pCur = pCursor;
  if (iVar7 != 0) {
    return iVar7;
  }
  local_48 = puVar2;
  if ((iFlag & 1U) == 0) {
    iVar7 = (*puVar3->xSeek)(pCursor,zName,nByte,1);
    if (((iFlag & 2U) == 0) && (iVar7 != 0)) {
      unqliteGenErrorFormat
                (pDb,"Collection \'%.*s\' not defined in the underlying database",(ulong)nByte,zName
                );
      unqliteReleaseCursor(pDb,pCur);
      return iVar7;
    }
    if ((iFlag & 2U) != 0) {
      unqliteReleaseCursor(pDb,pCur);
      return iVar7;
    }
  }
  pBackend = &pVm->sAlloc;
  pCol = (unqlite_col *)SyMemBackendPoolAlloc(pBackend,0x140);
  if (pCol == (unqlite_col *)0x0) {
    unqliteGenOutofMem(pDb);
    iVar7 = -1;
    pChunk = (char *)0x0;
  }
  else {
    SyZero(pCol,0x140);
    (pCol->sWorker).pBlob = (void *)0x0;
    (pCol->sWorker).nByte = 0;
    (pCol->sWorker).mByte = 0;
    (pCol->sWorker).pAllocator = pBackend;
    (pCol->sWorker).nFlags = 0;
    (pCol->sHeader).pBlob = (void *)0x0;
    (pCol->sHeader).nByte = 0;
    (pCol->sHeader).mByte = 0;
    (pCol->sHeader).pAllocator = pBackend;
    (pCol->sHeader).nFlags = 0;
    pCol->pVm = pVm;
    pCol->pCursor = pCursor;
    pChunk = SyMemBackendStrDup(pBackend,zName,nByte);
    if (pChunk == (char *)0x0) {
      unqliteGenOutofMem(pDb);
      iVar7 = -1;
      pChunk = (char *)0x0;
    }
    else {
      pCol->nRecSize = 0x40;
      pSrc = (unqlite_col_record **)SyMemBackendAlloc(pBackend,0x200);
      pCol->apRecord = pSrc;
      if (pSrc == (unqlite_col_record **)0x0) {
        unqliteGenOutofMem(pDb);
        iVar7 = -1;
      }
      else {
        SyZero(pSrc,pCol->nRecSize << 3);
        (pCol->sName).zString = pChunk;
        (pCol->sName).nByte = nByte;
        jx9MemObjInit(pVm->pJx9Vm,&pCol->sSchema);
        if ((iFlag & 1U) == 0) {
          SyBlobReset(&pCol->sHeader);
          iVar7 = (*pCol->pCursor->pStore->pIo->pMethods->xData)
                            (pCol->pCursor,unqliteDataConsumer,&pCol->sHeader);
          if (iVar7 == 0) {
            uVar10 = (pCol->sHeader).nByte;
            iVar7 = -0x18;
            if ((0x15 < uVar10) &&
               (puVar4 = (ushort *)(pCol->sHeader).pBlob,
               (ushort)(*puVar4 << 8 | *puVar4 >> 8) == 0x611e)) {
              SyBigEndianUnpack64((uchar *)(puVar4 + 1),(sxu64 *)&pCol->nLastid);
              SyBigEndianUnpack64((uchar *)(puVar4 + 5),(sxu64 *)&pCol->nTotRec);
              SyBigEndianUnpack32((uchar *)(puVar4 + 9),&local_34);
              SyDosTimeFormat(local_34,&pCol->sCreation);
              pCol->nSchemaOfft = (int)(puVar4 + 0xb) - *(int *)&(pCol->sHeader).pBlob;
              if (uVar10 != 0x16) {
                FastJsonDecode(puVar4 + 0xb,uVar10 - 0x16,&pCol->sSchema,(uchar **)0x0,0);
              }
LAB_001177cc:
              sVar8 = SyBinHash((pCol->sName).zString,(pCol->sName).nByte);
              pCol->nHash = sVar8;
              sVar1 = pVm->iColSize;
              uVar10 = sVar1 - 1 & sVar8;
              ppuVar9 = pVm->apCol;
              puVar5 = ppuVar9[uVar10];
              pCol->pNextCol = puVar5;
              if (puVar5 != (unqlite_col *)0x0) {
                puVar5->pPrevCol = pCol;
              }
              ppuVar9[uVar10] = pCol;
              puVar5 = pVm->pCol;
              if (puVar5 != (unqlite_col *)0x0) {
                pCol->pNext = puVar5;
                puVar5->pPrev = pCol;
              }
              pVm->pCol = pCol;
              uVar10 = pVm->iCol + 1;
              pVm->iCol = uVar10;
              if (uVar10 < 10000 && sVar1 * 4 <= uVar10) {
                ppuVar9 = (unqlite_col **)SyMemBackendAlloc(pBackend,sVar1 << 4);
                if (ppuVar9 != (unqlite_col **)0x0) {
                  ppuVar11 = &pVm->pCol;
                  SyZero(ppuVar9,sVar1 << 4);
                  sVar8 = pVm->iCol;
                  while (bVar12 = sVar8 != 0, sVar8 = sVar8 - 1, bVar12) {
                    puVar5 = *ppuVar11;
                    puVar5->pNextCol = (unqlite_col *)0x0;
                    puVar5->pPrevCol = (unqlite_col *)0x0;
                    uVar10 = puVar5->nHash & sVar1 * 2 - 1;
                    puVar6 = ppuVar9[uVar10];
                    puVar5->pNextCol = puVar6;
                    if (puVar6 != (unqlite_col *)0x0) {
                      puVar6->pPrevCol = puVar5;
                    }
                    ppuVar9[uVar10] = puVar5;
                    ppuVar11 = &puVar5->pNext;
                  }
                  SyMemBackendFree(pBackend,pVm->apCol);
                  pVm->apCol = ppuVar9;
                  pVm->iColSize = sVar1 * 2;
                }
              }
              if (local_40 == (unqlite_col **)0x0) {
                return 0;
              }
              *local_40 = pCol;
              return 0;
            }
          }
          unqliteGenErrorFormat(pDb,"Corrupt collection \'%z\' header",&pCol->sName);
        }
        else if (puVar3->xReplace ==
                 (_func_int_unqlite_kv_engine_ptr_void_ptr_int_void_ptr_unqlite_int64 *)0x0) {
          unqliteGenErrorFormat
                    (pDb,
                     "Cannot create new collection \'%z\' due to a read-only Key/Value storage engine"
                     ,&pCol->sName);
          iVar7 = -10;
        }
        else {
          iVar7 = CollectionSetHeader(local_48,pCol,0,0,(jx9_value *)0x0);
          if (iVar7 == 0) goto LAB_001177cc;
          iVar7 = -10;
        }
      }
    }
  }
  unqliteReleaseCursor(pDb,pCursor);
  if (pChunk != (char *)0x0) {
    SyMemBackendFree(pBackend,pChunk);
  }
  if (pCol != (unqlite_col *)0x0) {
    if (pCol->apRecord != (unqlite_col_record **)0x0) {
      SyMemBackendFree(pBackend,pCol->apRecord);
    }
    SyBlobRelease(&pCol->sHeader);
    SyBlobRelease(&pCol->sWorker);
    jx9MemObjRelease(&pCol->sSchema);
    SyMemBackendPoolFree(pBackend,pCol);
  }
  return iVar7;
}

Assistant:

static int unqliteVmLoadCollection(
	unqlite_vm *pVm,    /* Target VM */
	const char *zName,  /* Collection name */
	sxu32 nByte,        /* zName length */
	int iFlag,          /* Control flag */
	unqlite_col **ppOut /* OUT: in-memory collection */
	)
{
	unqlite_kv_methods *pMethods;
	unqlite_kv_engine *pEngine;
	unqlite_kv_cursor *pCursor;
	unqlite *pDb = pVm->pDb;
	unqlite_col *pCol = 0; /* cc warning */
	int rc = SXERR_MEM;
	char *zDup = 0;
	/* Point to the underlying KV store */
	pEngine = unqlitePagerGetKvEngine(pVm->pDb);
	pMethods = pEngine->pIo->pMethods;
	/* Allocate a new cursor */
	rc = unqliteInitCursor(pDb,&pCursor);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	if( (iFlag & UNQLITE_VM_COLLECTION_CREATE) == 0 ){
		/* Seek to the desired location */
		rc = pMethods->xSeek(pCursor,(const void *)zName,(int)nByte,UNQLITE_CURSOR_MATCH_EXACT);
		if( rc != UNQLITE_OK && (iFlag & UNQLITE_VM_COLLECTION_EXISTS) == 0){
			unqliteGenErrorFormat(pDb,"Collection '%.*s' not defined in the underlying database",nByte,zName);

			unqliteReleaseCursor(pDb,pCursor);
			return rc;
		}
		else if((iFlag & UNQLITE_VM_COLLECTION_EXISTS)){
			unqliteReleaseCursor(pDb,pCursor);
			return rc;
		}
	}
	/* Allocate a new instance */
	pCol = (unqlite_col *)SyMemBackendPoolAlloc(&pVm->sAlloc,sizeof(unqlite_col));
	if( pCol == 0 ){
		unqliteGenOutofMem(pDb);
		rc = UNQLITE_NOMEM;
		goto fail;
	}
	SyZero(pCol,sizeof(unqlite_col));
	/* Fill in the structure */
	SyBlobInit(&pCol->sWorker,&pVm->sAlloc);
	SyBlobInit(&pCol->sHeader,&pVm->sAlloc);
	pCol->pVm = pVm;
	pCol->pCursor = pCursor;
	/* Duplicate collection name */
	zDup = SyMemBackendStrDup(&pVm->sAlloc,zName,nByte);
	if( zDup == 0 ){
		unqliteGenOutofMem(pDb);
		rc = UNQLITE_NOMEM;
		goto fail;
	}
	pCol->nRecSize = 64; /* Must be a power of two */
	pCol->apRecord = (unqlite_col_record **)SyMemBackendAlloc(&pVm->sAlloc,pCol->nRecSize * sizeof(unqlite_col_record *));
	if( pCol->apRecord == 0 ){
		unqliteGenOutofMem(pDb);
		rc = UNQLITE_NOMEM;
		goto fail;
	}
	/* Zero the table */
	SyZero((void *)pCol->apRecord,pCol->nRecSize * sizeof(unqlite_col_record *));
	SyStringInitFromBuf(&pCol->sName,zDup,nByte);
	jx9MemObjInit(pVm->pJx9Vm,&pCol->sSchema);
	if( iFlag & UNQLITE_VM_COLLECTION_CREATE ){
		/* Create a new collection */
		if( pMethods->xReplace == 0 ){
			/* Read-only KV engine: Generate an error message and return */
			unqliteGenErrorFormat(pDb,
				"Cannot create new collection '%z' due to a read-only Key/Value storage engine",
				&pCol->sName
			);
			rc = UNQLITE_ABORT; /* Abort VM execution */
			goto fail;
		}
		/* Write the collection header */
		rc = CollectionSetHeader(pEngine,pCol,0,0,0);
		if( rc != UNQLITE_OK ){
			rc = UNQLITE_ABORT; /* Abort VM execution */
			goto fail;
		}
	}else{
		/* Read the collection header */
		rc = CollectionLoadHeader(pCol);
		if( rc != UNQLITE_OK ){
			unqliteGenErrorFormat(pDb,"Corrupt collection '%z' header",&pCol->sName);
			goto fail;
		}
	}
	/* Finally install the collection */
	unqliteVmInstallCollection(pVm,pCol);
	/* All done */
	if( ppOut ){
		*ppOut = pCol;
	}
	return UNQLITE_OK;
fail:
	unqliteReleaseCursor(pDb,pCursor);
	if( zDup ){
		SyMemBackendFree(&pVm->sAlloc,zDup);
	}
	if( pCol ){
		if( pCol->apRecord ){
			SyMemBackendFree(&pVm->sAlloc,(void *)pCol->apRecord);
		}
		SyBlobRelease(&pCol->sHeader);
		SyBlobRelease(&pCol->sWorker);
		jx9MemObjRelease(&pCol->sSchema);
		SyMemBackendPoolFree(&pVm->sAlloc,pCol);
	}
	return rc;
}